

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O2

void convert_index(dmr_C *C,expression *e)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (e->field_5).field_2.wide;
  uVar2 = (e->field_5).field_15.idx_to;
  *(undefined1 *)e = 0x1b;
  iVar3 = (e->ctype->field_14).field_1.normal;
  if (iVar3 < 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = C->target->bits_in_char;
    iVar4 = (iVar3 + iVar4 + -1) / iVar4;
  }
  (e->field_5).field_2.wide = iVar4 * iVar1;
  (e->field_5).field_15.idx_to = (uVar2 - iVar1) + 1;
  return;
}

Assistant:

static void convert_index(struct dmr_C *C, struct expression *e)
{
	struct expression *child = e->idx_expression;
	unsigned from = e->idx_from;
	unsigned to = e->idx_to + 1;
	e->type = EXPR_POS;
	e->init_offset = from * dmrC_bits_to_bytes(C->target, e->ctype->bit_size);
	e->init_nr = to - from;
	e->init_expr = child;
}